

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble *
trng::math::detail::inv_GammaP<long_double>
          (longdouble *__return_storage_ptr__,longdouble a,longdouble p)

{
  longdouble *plVar1;
  undefined8 uVar2;
  int iVar3;
  detail *in_RSI;
  bool bVar4;
  longdouble in_ST0;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  longdouble in_ST3;
  longdouble lVar9;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  
  sqrtl();
  lgammal();
  logl();
  lVar7 = in_ST6;
  expl();
  if (a <= (longdouble)1) {
    lVar8 = in_ST6;
    lVar9 = in_ST6;
    if ((longdouble)1 - (a * (longdouble)0.12 + (longdouble)0.253) * a <= p) {
      plVar1 = (longdouble *)log1pl();
      in_ST4 = (longdouble)1 - in_ST4;
      lVar7 = in_ST6;
    }
    else {
      plVar1 = (longdouble *)powl();
      lVar7 = in_ST6;
    }
  }
  else {
    in_ST5 = lVar7;
    logl();
    sqrtl();
    lVar8 = lVar7;
    sqrtl();
    lVar9 = lVar8;
    plVar1 = (longdouble *)powl();
    in_ST4 = in_ST6 * a;
    if (in_ST6 * a <= _DAT_002a99b0) {
      in_ST4 = _DAT_002a99b0;
    }
  }
  iVar3 = 0x3f;
  while( true ) {
    if (in_ST4 <= (longdouble)0) {
      return plVar1;
    }
    GammaP<long_double,true>(__return_storage_ptr__,in_RSI,a,in_ST4);
    if (a <= (longdouble)1) {
      logl();
      uVar2 = expl();
    }
    else {
      logl();
      uVar2 = expl();
      lVar7 = in_ST3 * lVar7;
    }
    lVar7 = (in_ST5 - p) / lVar7;
    lVar5 = (-(longdouble)1 + (-(longdouble)1 + a) / in_ST4) * lVar7;
    lVar6 = (longdouble)1;
    if (lVar6 <= lVar5) {
      lVar5 = lVar6;
    }
    lVar7 = lVar7 / (lVar6 - lVar5 * (longdouble)0.5);
    lVar6 = in_ST4 - lVar7;
    in_ST4 = (lVar7 + lVar6) * (longdouble)0.5;
    if ((longdouble)0 < lVar6) {
      in_ST4 = lVar6;
    }
    bVar4 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    plVar1 = (longdouble *)CONCAT71((int7)((ulong)uVar2 >> 8),bVar4);
    if (ABS(lVar7) < in_ST0 * in_ST4) break;
    in_ST5 = lVar8;
    lVar7 = lVar9;
    lVar8 = lVar9;
    if (bVar4) {
      return plVar1;
    }
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T inv_GammaP(T a, T p) {
        const T eps{sqrt(numeric_limits<T>::epsilon())};
        const T a1{a - 1};
        const T glna{ln_Gamma(a)};
        const T lna1{ln(a1)};
        const T afac{exp(a1 * (lna1 - 1) - glna)};
        T x;
        // initial guess
        if (a > T{1}) {
          const T pp{p < T{1} / T{2} ? p : 1 - p};
          const T t{sqrt(-2 * ln(pp))};
          x = (T{2.30753} + t * T{0.27061}) / (1 + t * (T{0.99229} + t * T{0.04481})) - t;
          x = p < T{1} / T{2} ? -x : x;
          x = utility::max(T{1} / T{1000}, a * pow(1 - 1 / (9 * a) - x / (3 * sqrt(a)), T{3}));
        } else {
          const T t{1 - a * (T{0.253} + a * T{0.12})};
          x = p < t ? pow(p / t, 1 / a) : 1 - ln1p(-(p - t) / (1 - t));
        }
        // refinement by Halley's method
        for (int i{0}; i < numeric_limits<T>::digits; ++i) {
          if (x <= 0) {
            x = 0;
            break;
          }
          const T err{GammaP<T, true>(a, x) - p};
          T t;
          if (a > 1)
            t = afac * exp(-(x - a1) + a1 * (ln(x) - lna1));
          else
            t = exp(-x + a1 * ln(x) - glna);
          const T u{err / t};
          t = u / (1 - utility::min(T{1}, u * ((a - 1) / x - 1)) / 2);
          x -= t;
          x = x <= 0 ? (x + t) / 2 : x;
          if (abs(t) < eps * x)
            break;
        }
        return x;
      }